

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O0

int64_t Assimp::FBX::ParseTokenAsInt64(Token *t)

{
  allocator<char> local_41;
  string local_40;
  int64_t local_20;
  int64_t i;
  char *err;
  Token *t_local;
  
  err = (char *)t;
  local_20 = ParseTokenAsInt64(t,(char **)&i);
  if (i != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,(char *)i,&local_41);
    anon_unknown.dwarf_c19d72::ParseError(&local_40,(Token *)err);
  }
  return local_20;
}

Assistant:

int64_t ParseTokenAsInt64(const Token& t)
{
    const char* err;
    const int64_t i = ParseTokenAsInt64(t, err);
    if (err) {
        ParseError(err, t);
    }
    return i;
}